

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo_p.h
# Opt level: O2

void __thiscall
QFileInfoPrivate::QFileInfoPrivate
          (QFileInfoPrivate *this,QFileSystemEntry *file,QFileSystemMetaData *data)

{
  qint64 qVar1;
  qint64 qVar2;
  qint64 qVar3;
  qint64 qVar4;
  uint uVar5;
  MetaDataFlags MVar6;
  MetaDataFlags MVar7;
  long lVar8;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QFileSystemEntry::QFileSystemEntry(&this->fileEntry,file);
  uVar5 = data->groupId_;
  (this->metaData).userId_ = data->userId_;
  (this->metaData).groupId_ = uVar5;
  MVar6.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  MVar7.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  qVar1 = data->size_;
  qVar2 = data->accessTime_;
  qVar3 = data->birthTime_;
  qVar4 = data->modificationTime_;
  (this->metaData).metadataChangeTime_ = data->metadataChangeTime_;
  (this->metaData).modificationTime_ = qVar4;
  (this->metaData).accessTime_ = qVar2;
  (this->metaData).birthTime_ = qVar3;
  (this->metaData).knownFlagsMask =
       (MetaDataFlags)
       MVar6.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (this->metaData).entryFlags =
       (MetaDataFlags)
       MVar7.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (this->metaData).size_ = qVar1;
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEntry *)&this->fileEngine,(QFileSystemMetaData *)&this->fileEntry);
  lVar8 = 0;
  memset(this->fileNames,0,0x138);
  do {
    QDateTime::QDateTime((QDateTime *)((long)(this->fileOwners + 2) + lVar8));
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  *(undefined8 *)&this->field_0x1d8 = 0x80000000;
  this->fileSize = 0;
  if ((this->fileEngine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl != (QAbstractFileEngine *)0x0
     ) {
    (this->metaData).knownFlagsMask = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0
    ;
    (this->metaData).entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
    (this->metaData).size_ = -1;
    (this->metaData).accessTime_ = 0;
    (this->metaData).birthTime_ = 0;
    (this->metaData).metadataChangeTime_ = 0;
    (this->metaData).modificationTime_ = 0;
    (this->metaData).userId_ = 0xfffffffe;
    (this->metaData).groupId_ = 0xfffffffe;
  }
  return;
}

Assistant:

inline QFileInfoPrivate(const QFileSystemEntry &file, const QFileSystemMetaData &data)
        : QSharedData(),
        fileEntry(file),
        metaData(data),
        fileEngine(QFileSystemEngine::createLegacyEngine(fileEntry, metaData)),
        cachedFlags(0),
        isDefaultConstructed(false),
        cache_enabled(true), fileFlags(0), fileSize(0)
    {
        //If the file engine is not null, this maybe a "mount point" for a custom file engine
        //in which case we can't trust the metadata
        if (fileEngine)
            metaData = QFileSystemMetaData();
    }